

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMultiSphereShape.cpp
# Opt level: O1

void __thiscall
cbtMultiSphereShape::cbtMultiSphereShape
          (cbtMultiSphereShape *this,cbtVector3 *positions,cbtScalar *radi,int numSpheres)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtScalar *pcVar3;
  int iVar4;
  cbtVector3 *ptr;
  float *pfVar5;
  undefined8 uVar6;
  cbtVector3 *pcVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  
  cbtConvexInternalAabbCachingShape::cbtConvexInternalAabbCachingShape
            (&this->super_cbtConvexInternalAabbCachingShape);
  (this->super_cbtConvexInternalAabbCachingShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape = (_func_int **)&PTR__cbtMultiSphereShape_00b72be8
  ;
  (this->m_localPositionArray).m_ownsMemory = true;
  (this->m_localPositionArray).m_data = (cbtVector3 *)0x0;
  (this->m_localPositionArray).m_size = 0;
  (this->m_localPositionArray).m_capacity = 0;
  (this->m_radiArray).m_ownsMemory = true;
  (this->m_radiArray).m_data = (float *)0x0;
  (this->m_radiArray).m_size = 0;
  (this->m_radiArray).m_capacity = 0;
  (this->super_cbtConvexInternalAabbCachingShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape.m_shapeType = 9;
  if (0 < numSpheres) {
    pcVar7 = (cbtVector3 *)cbtAlignedAllocInternal((ulong)(uint)numSpheres << 4,0x10);
    lVar8 = (long)(this->m_localPositionArray).m_size;
    if (0 < lVar8) {
      lVar10 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->m_localPositionArray).m_data)->m_floats + lVar10);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)pcVar7->m_floats + lVar10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar10 = lVar10 + 0x10;
      } while (lVar8 * 0x10 != lVar10);
    }
    ptr = (this->m_localPositionArray).m_data;
    if (ptr != (cbtVector3 *)0x0) {
      if ((this->m_localPositionArray).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_localPositionArray).m_data = (cbtVector3 *)0x0;
    }
    (this->m_localPositionArray).m_ownsMemory = true;
    (this->m_localPositionArray).m_data = pcVar7;
    (this->m_localPositionArray).m_capacity = numSpheres;
  }
  (this->m_localPositionArray).m_size = numSpheres;
  iVar4 = (this->m_radiArray).m_size;
  if (iVar4 <= numSpheres) {
    if ((iVar4 < numSpheres) && ((this->m_radiArray).m_capacity < numSpheres)) {
      if (numSpheres == 0) {
        pfVar9 = (float *)0x0;
      }
      else {
        pfVar9 = (float *)cbtAlignedAllocInternal((long)numSpheres << 2,0x10);
      }
      lVar8 = (long)(this->m_radiArray).m_size;
      if (0 < lVar8) {
        pfVar5 = (this->m_radiArray).m_data;
        lVar10 = 0;
        do {
          pfVar9[lVar10] = pfVar5[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar8 != lVar10);
      }
      pfVar5 = (this->m_radiArray).m_data;
      if (pfVar5 != (float *)0x0) {
        if ((this->m_radiArray).m_ownsMemory == true) {
          cbtAlignedFreeInternal(pfVar5);
        }
        (this->m_radiArray).m_data = (float *)0x0;
      }
      (this->m_radiArray).m_ownsMemory = true;
      (this->m_radiArray).m_data = pfVar9;
      (this->m_radiArray).m_capacity = numSpheres;
    }
    if (iVar4 < numSpheres) {
      memset((this->m_radiArray).m_data + iVar4,0,((long)numSpheres - (long)iVar4) * 4);
    }
  }
  (this->m_radiArray).m_size = numSpheres;
  if (0 < numSpheres) {
    lVar8 = 0;
    do {
      uVar6 = *(undefined8 *)(positions->m_floats + lVar8 + 2);
      pcVar3 = ((this->m_localPositionArray).m_data)->m_floats + lVar8;
      *(undefined8 *)pcVar3 = *(undefined8 *)(positions->m_floats + lVar8);
      *(undefined8 *)(pcVar3 + 2) = uVar6;
      *(undefined4 *)((long)(this->m_radiArray).m_data + lVar8) =
           *(undefined4 *)((long)radi + lVar8);
      lVar8 = lVar8 + 4;
    } while ((ulong)(uint)numSpheres << 2 != lVar8);
  }
  cbtConvexInternalAabbCachingShape::recalcLocalAabb(&this->super_cbtConvexInternalAabbCachingShape)
  ;
  return;
}

Assistant:

cbtMultiSphereShape::cbtMultiSphereShape(const cbtVector3* positions, const cbtScalar* radi, int numSpheres)
	: cbtConvexInternalAabbCachingShape()
{
	m_shapeType = MULTI_SPHERE_SHAPE_PROXYTYPE;
	//cbtScalar startMargin = cbtScalar(BT_LARGE_FLOAT);

	m_localPositionArray.resize(numSpheres);
	m_radiArray.resize(numSpheres);
	for (int i = 0; i < numSpheres; i++)
	{
		m_localPositionArray[i] = positions[i];
		m_radiArray[i] = radi[i];
	}

	recalcLocalAabb();
}